

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord2f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,texcoord2f *v)

{
  float fVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::texcoord2f> local_6c;
  undefined1 local_60 [8];
  optional<tinyusdz::value::texcoord2f> pv_1;
  undefined1 local_44 [8];
  optional<tinyusdz::value::texcoord2f> pv;
  texcoord2f *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (texcoord2f *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_007c9f08;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&pv.contained,t);
  bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)&pv.contained);
  if (bVar2) {
    get_default_value<tinyusdz::value::texcoord2f>
              ((optional<tinyusdz::value::texcoord2f> *)((long)&pv_1.contained + 4),this);
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::
    optional<tinyusdz::value::texcoord2f,_0>
              ((optional<tinyusdz::value::texcoord2f> *)local_44,
               (optional<tinyusdz::value::texcoord2f> *)((long)&pv_1.contained + 4));
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::~optional
              ((optional<tinyusdz::value::texcoord2f> *)((long)&pv_1.contained + 4));
    pv_1.contained._0_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_44);
    if ((bool)pv_1.contained._0_1_) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::value
                         ((optional<tinyusdz::value::texcoord2f> *)local_44);
      fVar1 = pvVar3->t;
      v->s = pvVar3->s;
      v->t = fVar1;
      this_local._7_1_ = 1;
    }
    pv_1.contained._1_3_ = 0;
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::~optional
              ((optional<tinyusdz::value::texcoord2f> *)local_44);
    if (pv_1.contained.data.__align != (anon_struct_4_0_00000001_for___align)0x0) goto LAB_007c9f08;
    bVar2 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar2) {
      this_local._7_1_ = 0;
      goto LAB_007c9f08;
    }
  }
  bVar2 = has_timesamples(this);
  if (bVar2) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::texcoord2f,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar2 = has_default(this);
    if (bVar2) {
      get_default_value<tinyusdz::value::texcoord2f>(&local_6c,this);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::
      optional<tinyusdz::value::texcoord2f,_0>
                ((optional<tinyusdz::value::texcoord2f> *)local_60,&local_6c);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::~optional(&local_6c);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_60);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::value
                           ((optional<tinyusdz::value::texcoord2f> *)local_60);
        fVar1 = pvVar3->t;
        v->s = pvVar3->s;
        v->t = fVar1;
        this_local._7_1_ = 1;
      }
      pv_1.contained._1_3_ = 0;
      pv_1.contained._0_1_ = bVar2;
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::~optional
                ((optional<tinyusdz::value::texcoord2f> *)local_60);
      if (pv_1.contained.data.__align != (anon_struct_4_0_00000001_for___align)0x0)
      goto LAB_007c9f08;
    }
    this_local._7_1_ = 0;
  }
LAB_007c9f08:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }